

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
DirectChainedMap<TypeFunction_*>::insert
          (DirectChainedMap<TypeFunction_*> *this,uint hash,TypeFunction *value)

{
  Node *pNVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar6;
  Node *pNVar5;
  
  uVar3 = this->bucketCount;
  uVar6 = this->count;
  if (uVar3 <= (uVar6 >> 2) + uVar6) {
    rehash(this);
    uVar3 = this->bucketCount;
    uVar6 = this->count;
  }
  this->count = uVar6 + 1;
  pNVar1 = this->data + (ulong)(uVar3 - 1 & hash) * 0x18;
  if (*(long *)(pNVar1 + 0x10) == 0) {
    *(uint *)pNVar1 = hash;
    pNVar5 = pNVar1;
  }
  else {
    iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
    pNVar5 = (Node *)CONCAT44(extraout_var,iVar4);
    *(uint *)pNVar5 = *(uint *)pNVar1;
    uVar2 = *(undefined8 *)(pNVar1 + 0x10);
    *(undefined8 *)(pNVar5 + 8) = *(undefined8 *)(pNVar1 + 8);
    *(undefined8 *)(pNVar5 + 0x10) = uVar2;
    *(uint *)pNVar1 = hash;
  }
  *(TypeFunction **)(pNVar1 + 8) = value;
  *(Node **)(pNVar1 + 0x10) = pNVar5;
  return;
}

Assistant:

void insert(unsigned hash, Value value)
	{
		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		count++;

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *target = &data[bucket];

		if(target->next == NULL)
		{
			target->hash = hash;
			target->value = value;
			target->next = target; // Cycle lets us know that this is the last node
		}
		else
		{
			Node *n = (Node*)allocator->alloc(sizeof(Node));

			n->hash = target->hash;
			n->value = target->value;
			n->next = target->next;

			target->hash = hash;
			target->value = value;
			target->next = n;
		}
	}